

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::warn
          (TIntermediate *this,TInfoSink *infoSink,char *message,EShLanguage unitStage)

{
  EShLanguage EVar1;
  char *s;
  char *pcVar2;
  
  TInfoSinkBase::append(&infoSink->info,"WARNING: ");
  if (unitStage == EShLangCount) {
    TInfoSinkBase::append(&infoSink->info,"Linking ");
    unitStage = this->language;
  }
  else {
    EVar1 = this->language;
    TInfoSinkBase::append(&infoSink->info,"Linking ");
    if (EVar1 != EShLangCount) {
      pcVar2 = StageName(this->language);
      TInfoSinkBase::append(&infoSink->info,pcVar2);
      TInfoSinkBase::append(&infoSink->info," and ");
      pcVar2 = " stages: ";
      goto LAB_003ee1b7;
    }
  }
  pcVar2 = " stage: ";
LAB_003ee1b7:
  s = StageName(unitStage);
  TInfoSinkBase::append(&infoSink->info,s);
  TInfoSinkBase::append(&infoSink->info,pcVar2);
  TInfoSinkBase::append(&infoSink->info,message);
  TInfoSinkBase::append(&infoSink->info,"\n");
  return;
}

Assistant:

void TIntermediate::warn(TInfoSink& infoSink, const char* message, EShLanguage unitStage)
{
    infoSink.info.prefix(EPrefixWarning);
    if (unitStage == EShLangCount)
        infoSink.info << "Linking " << StageName(language) << " stage: " << message << "\n";
    else if (language == EShLangCount)
        infoSink.info << "Linking " << StageName(unitStage) << " stage: " << message << "\n";
    else
        infoSink.info << "Linking " << StageName(language) << " and " << StageName(unitStage) << " stages: " << message << "\n";
}